

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MQTT.hpp
# Opt level: O0

void __thiscall
Protocol::MQTT::V5::Property<Protocol::MQTT::Common::VBInt>::dump
          (Property<Protocol::MQTT::Common::VBInt> *this,FastString *out,int indent)

{
  char *pcVar1;
  String local_30;
  int local_1c;
  FastString *pFStack_18;
  int indent_local;
  FastString *out_local;
  Property<Protocol::MQTT::Common::VBInt> *this_local;
  
  local_1c = indent;
  pFStack_18 = out;
  out_local = (FastString *)this;
  pcVar1 = PrivateRegistry::getPropertyName((this->super_PropertyBase).type);
  MQTTStringPrintf((char *)&local_30,"%*sType %s\n",(ulong)(uint)indent,"",pcVar1);
  Bstrlib::String::operator+=(pFStack_18,&local_30);
  Bstrlib::String::~String(&local_30);
  Common::VBInt::dump(&this->value,pFStack_18,local_1c + 2);
  return;
}

Assistant:

void dump(MQTTString & out, const int indent = 0)
                {
                    out += MQTTStringPrintf("%*sType %s\n", indent, "", PrivateRegistry::getPropertyName(type));
                    value.dump(out, indent + 2);
                }